

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O1

int lws_role_call_client_bind(lws *wsi,lws_client_connect_info *i)

{
  lws_role_ops *plVar1;
  int iVar2;
  int unaff_EBP;
  lws_role_ops *ar;
  lws_role_ops **pplVar3;
  bool bVar4;
  
  pplVar3 = available_roles;
  do {
    plVar1 = *pplVar3;
    if (plVar1 == (lws_role_ops *)0x0) break;
    if (plVar1->client_bind == (_func_int_lws_ptr_lws_client_connect_info_ptr *)0x0) {
      bVar4 = true;
    }
    else {
      iVar2 = (*plVar1->client_bind)(wsi,i);
      bVar4 = iVar2 == 0;
      if (!bVar4) {
        unaff_EBP = 0;
      }
      if (iVar2 < 0) {
        unaff_EBP = iVar2;
      }
    }
    pplVar3 = pplVar3 + 1;
  } while (bVar4);
  if (plVar1 == (lws_role_ops *)0x0) {
    iVar2 = rops_client_bind_raw_skt(wsi,i);
    unaff_EBP = 0;
    if (iVar2 == 0) {
      unaff_EBP = 1;
    }
  }
  return unaff_EBP;
}

Assistant:

int
lws_role_call_client_bind(struct lws *wsi,
			  const struct lws_client_connect_info *i)
{
	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
		if (ar->client_bind) {
			int m = ar->client_bind(wsi, i);
			if (m < 0)
				return m;
			if (m)
				return 0;
		}
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;

	/* fall back to raw socket role if, eg, h1 not configured */

	if (role_ops_raw_skt.client_bind &&
	    role_ops_raw_skt.client_bind(wsi, i))
		return 0;

	return 1;
}